

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

UtcTimeOnly * FIX::UtcTimeOnlyConvertor::convert(UtcTimeOnly *__return_storage_ptr__,string *value)

{
  ulong uVar1;
  char *pcVar2;
  FieldConvertError *this;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = value->_M_string_length;
  if (uVar1 - 0x13 < 0xfffffffffffffff5) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
  else {
    lVar3 = 0;
    do {
      if (9 < (int)(value->_M_dataplus)._M_p[lVar3] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_0015faf2;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 2);
    pcVar2 = (value->_M_dataplus)._M_p;
    if (pcVar2[2] == ':') {
      lVar3 = 3;
      do {
        if (9 < (int)pcVar2[lVar3] - 0x30U) {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
          goto LAB_0015faf2;
        }
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 == 4);
      if (pcVar2[5] == ':') {
        lVar3 = 6;
        do {
          if (9 < (int)pcVar2[lVar3] - 0x30U) {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
            goto LAB_0015faf2;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 == 7);
        if ((int)pcVar2[1] + *pcVar2 * 10 + -0x1e0 < 0x48) {
          if ((int)pcVar2[4] + pcVar2[3] * 10 + -0x1e0 < 0x6c) {
            if ((int)pcVar2[7] + pcVar2[6] * 10 + -0x1e0 < 0x6d) {
              iVar7 = (int)pcVar2[1] + *pcVar2 * 10 + -0x210;
              iVar5 = (int)pcVar2[4] + pcVar2[3] * 10 + -0x210;
              lVar3 = (long)pcVar2[7] + (long)pcVar2[6] * 10 + -0x210;
              if (uVar1 == 8) {
                (__return_storage_ptr__->super_DateTime).m_date = 0;
                (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                     (_func_int **)&PTR__DateTime_001eda38;
                lVar3 = (lVar3 + (iVar5 * 0x3c + iVar7 * 0xe10)) * 1000000000;
              }
              else {
                if (pcVar2[8] != '.') {
                  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                  FieldConvertError::FieldConvertError(this,value);
                  goto LAB_0015faf2;
                }
                iVar6 = 0;
                if (9 < uVar1) {
                  uVar4 = 9;
                  iVar6 = 0;
                  do {
                    if (9 < (int)pcVar2[uVar4] - 0x30U) {
                      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
                      FieldConvertError::FieldConvertError(this,value);
                      goto LAB_0015faf2;
                    }
                    iVar6 = (int)pcVar2[uVar4] + iVar6 * 10 + -0x30;
                    uVar4 = uVar4 + 1;
                  } while (uVar1 != uVar4);
                }
                (__return_storage_ptr__->super_DateTime).m_date = 0;
                (__return_storage_ptr__->super_DateTime).m_time = 0;
                (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
                     (_func_int **)&PTR__DateTime_001eda38;
                iVar6 = DateTime::convertToNanos(iVar6,(int)uVar1 + -9);
                lVar3 = (long)iVar6 +
                        ((long)(int)lVar3 + (long)(iVar5 * 0x3c + iVar7 * 0xe10)) * 1000000000;
              }
              (__return_storage_ptr__->super_DateTime).m_time = lVar3;
              return __return_storage_ptr__;
            }
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
          else {
            this = (FieldConvertError *)__cxa_allocate_exception(0x50);
            FieldConvertError::FieldConvertError(this,value);
          }
        }
        else {
          this = (FieldConvertError *)__cxa_allocate_exception(0x50);
          FieldConvertError::FieldConvertError(this,value);
        }
      }
      else {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
      }
    }
    else {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
LAB_0015faf2:
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

static UtcTimeOnly convert( const std::string& value)
  EXCEPT ( FieldConvertError )
  {
    size_t len = value.size();
    if (len < 8 || len > 18) throw FieldConvertError(value);

    size_t i = 0;
    int c = 0;
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);
    if( value[i++] != ':' ) throw FieldConvertError(value);
    for( c = 0; c < 2; ++c )
      if( !IS_DIGIT(value[i++]) ) throw FieldConvertError(value);

    int hour, min, sec;

    i = 0;

    hour = value[i++] - '0';
    hour = 10 * hour + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 23 < hour ) throw FieldConvertError(value);

    ++i; // skip ':'

    min = value[i++] - '0';
    min = 10 * min + value[i++] - '0';
    // No check for >= 0 as no '-' are converted here
    if( 59 < min ) throw FieldConvertError(value);

    ++i; // skip ':'

    sec = value[i++] - '0';
    sec = 10 * sec + value[i++] - '0';

    // No check for >= 0 as no '-' are converted here
    if( 60 < sec ) throw FieldConvertError(value);

    if (len == 8)
      return UtcTimeOnly (hour, min, sec, 0);

    if( value[i++] != '.' ) throw FieldConvertError(value);

    int fraction = 0;
    for (; i < len; ++i)
    {
      char ch = value[i];
      if( !IS_DIGIT(ch)) throw FieldConvertError(value);
      fraction = (fraction * 10) + ch - '0';
    }

    return UtcTimeOnly (hour, min, sec, fraction, len - 8 - 1);
  }